

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,scatter_record *srec)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  cosine_pdf *pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_39;
  cosine_pdf *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  double local_28;
  
  (*((this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_texture[2])
            (SUB84(rec->u,0),&local_38);
  (srec->attenuation).e[2] = local_28;
  (srec->attenuation).e[0] = (double)local_38;
  (srec->attenuation).e[1] = (double)_Stack_30._M_pi;
  local_38 = (cosine_pdf *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cosine_pdf,std::allocator<cosine_pdf>,vec3_const&>
            (&_Stack_30,&local_38,(allocator<cosine_pdf> *)&local_39,&rec->normal);
  _Var2._M_pi = _Stack_30._M_pi;
  pcVar1 = local_38;
  local_38 = (cosine_pdf *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (srec->pdf_ptr).super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (srec->pdf_ptr).super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &pcVar1->super_pdf;
  (srec->pdf_ptr).super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  srec->skip_pdf = false;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, scatter_record& srec) const override {
        srec.attenuation = tex->value(rec.u, rec.v, rec.p);
        srec.pdf_ptr = make_shared<cosine_pdf>(rec.normal);
        srec.skip_pdf = false;
        return true;
    }